

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall spirv_cross::SPIRType::SPIRType(SPIRType *this,Op op_)

{
  Op op__local;
  SPIRType *this_local;
  
  IVariant::IVariant(&this->super_IVariant);
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRType_005bdf00;
  *(Op *)&(this->super_IVariant).field_0xc = op_;
  this->basetype = Unknown;
  this->width = 0;
  this->vecsize = 1;
  this->columns = 1;
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->array);
  SmallVector<bool,_8UL>::SmallVector(&this->array_size_literal);
  this->pointer_depth = 0;
  this->pointer = false;
  this->forward_pointer = false;
  this->storage = StorageClassGeneric;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::SmallVector(&this->member_types);
  SmallVector<unsigned_int,_8UL>::SmallVector(&this->member_type_index_redirection);
  (this->image).type.id = 0;
  TypedID<(spirv_cross::Types)1>::TypedID(&(this->image).type);
  (this->image).dim = Dim1D;
  (this->image).depth = false;
  (this->image).arrayed = false;
  (this->image).ms = false;
  (this->image).sampled = 0;
  (this->image).format = ImageFormatUnknown;
  (this->image).access = AccessQualifierReadOnly;
  TypedID<(spirv_cross::Types)1>::TypedID(&this->type_alias,0);
  TypedID<(spirv_cross::Types)1>::TypedID(&this->parent_type,0);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->member_name_cache);
  return;
}

Assistant:

explicit SPIRType(spv::Op op_) : op(op_) {}